

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_loader_impl.c
# Opt level: O1

function_return
function_mock_interface_invoke(function func,function_impl impl,void **args,size_t size)

{
  bool bVar1;
  undefined4 uVar2;
  double *value_ptr;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  function_return pvVar6;
  undefined8 uVar7;
  char *pcVar8;
  size_t args_count;
  size_t sVar9;
  double dVar10;
  double *pdVar11;
  undefined4 uVar12;
  
  uVar3 = function_signature();
  uVar4 = function_name(func);
  lVar5 = signature_get_return(uVar3);
  log_write_impl_va("metacall",0x4a,"function_mock_interface_invoke",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                    ,0,"Invoking mock function %s",uVar4);
  if (size == 0) {
    log_write_impl_va("metacall",0x98,"function_mock_interface_invoke",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                      ,0,"Calling mock function without arguments",uVar4);
  }
  else {
    sVar9 = 0;
    do {
      uVar4 = signature_get_type(uVar3,sVar9);
      uVar2 = type_index(uVar4);
      uVar12 = uVar2;
      log_write_impl_va("metacall",0x56,"function_mock_interface_invoke",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                        ,0,"Type %p, %d",uVar4,uVar2);
      pdVar11 = (double *)args[sVar9];
      switch(uVar2) {
      case 0:
        pdVar11 = (double *)(ulong)*(byte *)pdVar11;
        uVar4 = 0x5c;
        uVar7 = 0;
        pcVar8 = "Boolean value: %d";
        break;
      case 1:
        pdVar11 = (double *)(ulong)(uint)(int)*(char *)pdVar11;
        uVar4 = 0x62;
        uVar7 = 0;
        pcVar8 = "Char value: %c";
        break;
      case 2:
        pdVar11 = (double *)(ulong)(uint)(int)*(short *)pdVar11;
        uVar4 = 0x68;
        uVar7 = 0;
        pcVar8 = "Short value: %d";
        break;
      case 3:
        pdVar11 = (double *)(ulong)(uint)*(float *)pdVar11;
        uVar4 = 0x6e;
        uVar7 = 0;
        pcVar8 = "Int value: %d";
        break;
      case 4:
        pdVar11 = (double *)*pdVar11;
        uVar4 = 0x74;
        uVar7 = 0;
        pcVar8 = "Long value: %ld";
        break;
      case 5:
        dVar10 = (double)*(float *)pdVar11;
        uVar7 = 0x7a;
        pcVar8 = "Float value: %f";
        goto LAB_001024d2;
      case 6:
        dVar10 = *pdVar11;
        uVar7 = 0x80;
        pcVar8 = "Double value: %f";
LAB_001024d2:
        log_write_impl_va(dVar10,"metacall",uVar7,"function_mock_interface_invoke",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                          ,0,pcVar8,uVar4,uVar12);
        goto LAB_00102597;
      case 7:
        uVar4 = 0x86;
        uVar7 = 0;
        pcVar8 = "String value: %s";
        break;
      default:
        uVar4 = 0x90;
        uVar7 = 3;
        pcVar8 = "Unrecognized value: %p";
        break;
      case 0xb:
        uVar4 = 0x8c;
        uVar7 = 0;
        pcVar8 = "Pointer value: %p";
      }
      log_write_impl_va("metacall",uVar4,"function_mock_interface_invoke",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                        ,uVar7,pcVar8,pdVar11,uVar12);
LAB_00102597:
      sVar9 = sVar9 + 1;
    } while (size != sVar9);
    log_write_impl_va("metacall",0x94,"function_mock_interface_invoke",
                      "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                      ,0,"Calling mock function with arguments (%lu)",size,uVar12);
  }
  if (lVar5 == 0) {
    return (function_return)0x0;
  }
  uVar2 = type_index(lVar5);
  uVar12 = uVar2;
  log_write_impl_va("metacall",0x9f,"function_mock_interface_invoke",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                    ,0,"Return type %p, %d",lVar5,uVar2);
  switch(uVar2) {
  case 0:
    pvVar6 = (function_return)value_create_bool(1);
    break;
  case 1:
    pvVar6 = (function_return)value_create_char(0x41);
    break;
  case 2:
    pvVar6 = (function_return)value_create_short(0x7c);
    break;
  case 3:
    pvVar6 = (function_return)value_create_int(0x4d2);
    break;
  case 4:
    pvVar6 = (function_return)value_create_long(90000);
    break;
  case 5:
    pvVar6 = (function_return)value_create_float(0x3e4ccccd);
    break;
  case 6:
    pvVar6 = (function_return)value_create_double(0x400921ff2e48e8a7);
    break;
  case 7:
    pvVar6 = (function_return)value_create_string("Hello World",0xb);
    break;
  default:
    pvVar6 = (function_return)
             log_write_impl_va("metacall",0xcd,"function_mock_interface_invoke",
                               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/loaders/mock_loader/source/mock_loader_impl.c"
                               ,3,"Unrecognized return type",lVar5,uVar12);
    bVar1 = true;
    goto LAB_001026e0;
  case 0xb:
    pvVar6 = (function_return)value_create_ptr(&function_mock_interface_invoke::int_val);
  }
  bVar1 = false;
LAB_001026e0:
  if (bVar1) {
    return (function_return)0x0;
  }
  return pvVar6;
}

Assistant:

function_return function_mock_interface_invoke(function func, function_impl impl, function_args args, size_t size)
{
	loader_impl_mock_function mock_function = (loader_impl_mock_function)impl;

	signature s = function_signature(func);

	const char *name = function_name(func);

	type ret_type = signature_get_return(s);

	(void)mock_function;

	log_write("metacall", LOG_LEVEL_DEBUG, "Invoking mock function %s", name);

	if (size > 0)
	{
		size_t args_count;

		for (args_count = 0; args_count < size; ++args_count)
		{
			type t = signature_get_type(s, args_count);

			type_id id = type_index(t);

			log_write("metacall", LOG_LEVEL_DEBUG, "Type %p, %d", (void *)t, id);

			if (id == TYPE_BOOL)
			{
				boolean *value_ptr = (boolean *)(args[args_count]);

				log_write("metacall", LOG_LEVEL_DEBUG, "Boolean value: %d", *value_ptr);
			}
			else if (id == TYPE_CHAR)
			{
				char *value_ptr = (char *)(args[args_count]);

				log_write("metacall", LOG_LEVEL_DEBUG, "Char value: %c", *value_ptr);
			}
			else if (id == TYPE_SHORT)
			{
				short *value_ptr = (short *)(args[args_count]);

				log_write("metacall", LOG_LEVEL_DEBUG, "Short value: %d", *value_ptr);
			}
			else if (id == TYPE_INT)
			{
				int *value_ptr = (int *)(args[args_count]);

				log_write("metacall", LOG_LEVEL_DEBUG, "Int value: %d", *value_ptr);
			}
			else if (id == TYPE_LONG)
			{
				long *value_ptr = (long *)(args[args_count]);

				log_write("metacall", LOG_LEVEL_DEBUG, "Long value: %ld", *value_ptr);
			}
			else if (id == TYPE_FLOAT)
			{
				float *value_ptr = (float *)(args[args_count]);

				log_write("metacall", LOG_LEVEL_DEBUG, "Float value: %f", *value_ptr);
			}
			else if (id == TYPE_DOUBLE)
			{
				double *value_ptr = (double *)(args[args_count]);

				log_write("metacall", LOG_LEVEL_DEBUG, "Double value: %f", *value_ptr);
			}
			else if (id == TYPE_STRING)
			{
				const char *value_ptr = (const char *)(args[args_count]);

				log_write("metacall", LOG_LEVEL_DEBUG, "String value: %s", value_ptr);
			}
			else if (id == TYPE_PTR)
			{
				void *value_ptr = (void *)(args[args_count]);

				log_write("metacall", LOG_LEVEL_DEBUG, "Pointer value: %p", value_ptr);
			}
			else
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Unrecognized value: %p", args[args_count]);
			}
		}

		log_write("metacall", LOG_LEVEL_DEBUG, "Calling mock function with arguments (%lu)", size);
	}
	else
	{
		log_write("metacall", LOG_LEVEL_DEBUG, "Calling mock function without arguments");
	}

	if (ret_type != NULL)
	{
		type_id id = type_index(ret_type);

		log_write("metacall", LOG_LEVEL_DEBUG, "Return type %p, %d", (void *)ret_type, id);

		if (id == TYPE_BOOL)
		{
			boolean b = 1;

			return value_create_bool(b);
		}
		else if (id == TYPE_CHAR)
		{
			return value_create_char('A');
		}
		else if (id == TYPE_SHORT)
		{
			return value_create_short(124);
		}
		else if (id == TYPE_INT)
		{
			return value_create_int(1234);
		}
		else if (id == TYPE_LONG)
		{
			return value_create_long(90000L);
		}
		else if (id == TYPE_FLOAT)
		{
			return value_create_float(0.2f);
		}
		else if (id == TYPE_DOUBLE)
		{
			return value_create_double(3.1416);
		}
		else if (id == TYPE_STRING)
		{
			static const char str[] = "Hello World";

			return value_create_string(str, sizeof(str) - 1);
		}
		else if (id == TYPE_PTR)
		{
			static int int_val = 15;

			return value_create_ptr(&int_val);
		}
		else
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Unrecognized return type");
		}
	}

	return NULL;
}